

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImGuiTabBar *tab_bar;
  float fVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  undefined8 *puVar4;
  ImGuiTabBar *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiWindow *pIVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar11;
  undefined8 uVar12;
  long lVar13;
  ImDrawList *this;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  ImGuiTabItem *tab;
  char buf [256];
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 aIStack_130 [32];
  
  bVar8 = Begin("ImGui Metrics",p_open,0);
  pIVar6 = GImGui;
  if (!bVar8) {
    End();
    return;
  }
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xc10,"ImGuiIO &ImGui::GetIO()");
  }
  Text("Dear ImGui %s","1.70");
  fVar1 = (pIVar6->IO).Framerate;
  Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar1),0),
       (double)fVar1);
  iVar2 = (pIVar6->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar6->IO).MetricsRenderVertices,
       (long)iVar2,(ulong)(uint)(iVar2 / 3));
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar6->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar6->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar6->IO).MetricsActiveAllocations);
  Separator();
  pIVar6 = GImGui;
  windows = &GImGui->Windows;
  ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
  bVar8 = TreeNode("DrawList","Active DrawLists (%d)",
                   (ulong)(uint)(pIVar6->DrawDataBuilder).Layers[0].Size);
  if (bVar8) {
    if (0 < (pIVar6->DrawDataBuilder).Layers[0].Size) {
      lVar13 = 0;
      pcVar11 = extraout_RDX;
      do {
        ShowMetricsWindow::Funcs::NodeDrawList
                  ((ImGuiWindow *)0x0,(pIVar6->DrawDataBuilder).Layers[0].Data[lVar13],pcVar11);
        lVar13 = lVar13 + 1;
        pcVar11 = extraout_RDX_00;
      } while (lVar13 < (pIVar6->DrawDataBuilder).Layers[0].Size);
    }
    TreePop();
  }
  bVar8 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar6->OpenPopupStack).Size);
  if (bVar8) {
    if (0 < (pIVar6->OpenPopupStack).Size) {
      lVar16 = 8;
      lVar13 = 0;
      do {
        pIVar3 = (pIVar6->OpenPopupStack).Data;
        puVar4 = *(undefined8 **)((long)&pIVar3->PopupId + lVar16);
        pcVar10 = "";
        pcVar11 = "NULL";
        pcVar14 = "";
        if (puVar4 != (undefined8 *)0x0) {
          pcVar11 = (char *)*puVar4;
          pcVar10 = " ChildWindow";
          if ((*(uint *)((long)puVar4 + 0xc) >> 0x18 & 1) == 0) {
            pcVar10 = "";
          }
          pcVar14 = " ChildMenu";
          if ((*(uint *)((long)puVar4 + 0xc) >> 0x1c & 1) == 0) {
            pcVar14 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar3 + lVar16 + -8),
                   pcVar11,pcVar10,pcVar14);
        lVar13 = lVar13 + 1;
        lVar16 = lVar16 + 0x30;
      } while (lVar13 < (pIVar6->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar8 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar6->TabBars).Data.Size);
  if (bVar8) {
    if (0 < (pIVar6->TabBars).Data.Size) {
      lVar13 = 0;
      do {
        pIVar5 = (pIVar6->TabBars).Data.Data;
        tab_bar = pIVar5 + lVar13;
        pcVar11 = "";
        if (pIVar5[lVar13].PrevFrameVisible < GImGui->FrameCount + -2) {
          pcVar11 = " *Inactive*";
        }
        ImFormatString((char *)&local_138,0x100,"TabBar (%d tabs)%s",
                       (ulong)(uint)pIVar5[lVar13].Tabs.Size,pcVar11);
        bVar8 = TreeNode(tab_bar,"%s",&local_138);
        if (bVar8) {
          if (0 < (tab_bar->Tabs).Size) {
            lVar16 = 0;
            uVar15 = 0;
            do {
              tab = (ImGuiTabItem *)((long)&((tab_bar->Tabs).Data)->ID + lVar16);
              PushID(tab);
              bVar8 = SmallButton("<");
              if (bVar8) {
                TabBarQueueChangeTabOrder(tab_bar,tab,-1);
              }
              pIVar9 = GImGui->CurrentWindow;
              pIVar9->WriteAccessed = true;
              if (pIVar9->SkipItems == false) {
                fVar1 = (pIVar9->DC).CursorPosPrevLine.y;
                (pIVar9->DC).CursorPos.x = (pIVar9->DC).CursorPosPrevLine.x + 2.0;
                (pIVar9->DC).CursorPos.y = fVar1;
                (pIVar9->DC).CurrentLineSize = (pIVar9->DC).PrevLineSize;
                (pIVar9->DC).CurrentLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
              }
              bVar8 = SmallButton(">");
              if (bVar8) {
                TabBarQueueChangeTabOrder(tab_bar,tab,1);
              }
              pIVar7 = GImGui;
              pIVar9 = GImGui->CurrentWindow;
              pIVar9->WriteAccessed = true;
              if (pIVar9->SkipItems == false) {
                (pIVar9->DC).CursorPos.x =
                     (pIVar7->Style).ItemSpacing.x + (pIVar9->DC).CursorPosPrevLine.x;
                (pIVar9->DC).CursorPos.y = (pIVar9->DC).CursorPosPrevLine.y;
                (pIVar9->DC).CurrentLineSize = (pIVar9->DC).PrevLineSize;
                (pIVar9->DC).CurrentLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
              }
              uVar12 = 0x2a;
              if (tab->ID != tab_bar->SelectedTabId) {
                uVar12 = 0x20;
              }
              Text("%02d%c Tab 0x%08X",uVar15 & 0xffffffff,uVar12);
              PopID();
              uVar15 = uVar15 + 1;
              lVar16 = lVar16 + 0x20;
            } while ((long)uVar15 < (long)(tab_bar->Tabs).Size);
          }
          TreePop();
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pIVar6->TabBars).Data.Size);
    }
    TreePop();
  }
  bVar8 = TreeNode("Internal state");
  if (bVar8) {
    pcVar10 = "NULL";
    pcVar11 = "NULL";
    if (pIVar6->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar6->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar11);
    pcVar11 = "NULL";
    if (pIVar6->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar6->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar11);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
         SUB84((double)pIVar6->HoveredIdTimer,0),(ulong)pIVar6->HoveredId,
         (ulong)pIVar6->HoveredIdPreviousFrame,(ulong)pIVar6->HoveredIdAllowOverlap);
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar6->ActiveIdTimer,0),(ulong)pIVar6->ActiveId,
         (ulong)pIVar6->ActiveIdPreviousFrame,(ulong)pIVar6->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_0018d6f0 + (ulong)pIVar6->ActiveIdSource * 8));
    pcVar11 = "NULL";
    if (pIVar6->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar6->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar11);
    pcVar11 = "NULL";
    if (pIVar6->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar6->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar11);
    pcVar11 = "NULL";
    if (pIVar6->NavWindow != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar6->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar11);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar6->NavId,(ulong)pIVar6->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_0018d6f0 + (ulong)pIVar6->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar6->IO).NavActive,
         (ulong)(pIVar6->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar6->NavActivateId,
         (ulong)pIVar6->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar6->NavDisableHighlight,
         (ulong)pIVar6->NavDisableMouseHover);
    if (pIVar6->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar6->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar10);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar6->DragDropActive,
         (ulong)(pIVar6->DragDropPayload).SourceId,(pIVar6->DragDropPayload).DataType,
         (ulong)(uint)(pIVar6->DragDropPayload).DataSize);
    TreePop();
  }
  bVar8 = TreeNode("Tools");
  if (bVar8) {
    Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
    Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
    pIVar7 = GImGui;
    pIVar9 = GImGui->CurrentWindow;
    pIVar9->WriteAccessed = true;
    if (pIVar9->SkipItems == false) {
      (pIVar9->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar9->DC).CursorPosPrevLine.x;
      (pIVar9->DC).CursorPos.y = (pIVar9->DC).CursorPosPrevLine.y;
      (pIVar9->DC).CurrentLineSize = (pIVar9->DC).PrevLineSize;
      (pIVar9->DC).CurrentLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
      pIVar9 = pIVar7->CurrentWindow;
    }
    fVar1 = pIVar7->FontSize;
    pIVar9->WriteAccessed = true;
    (pIVar9->DC).NextItemWidth = fVar1 * 12.0;
    bVar8 = Combo("##rects_type",&ShowMetricsWindow::show_windows_rect_type,"OuterRect",-1);
    ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar8);
    Checkbox("Show clipping rectangle when hovering ImDrawCmd node",
             &ShowMetricsWindow::show_drawcmd_clip_rects);
    TreePop();
  }
  if (((ShowMetricsWindow::show_windows_rects != false) ||
      (ShowMetricsWindow::show_windows_begin_order == true)) && (0 < windows->Size)) {
    lVar13 = 0;
    do {
      pIVar9 = (pIVar6->Windows).Data[lVar13];
      if (pIVar9->WasActive != true) goto LAB_0011fcd1;
      this = &GImGui->ForegroundDrawList;
      if (ShowMetricsWindow::show_windows_rects != true) goto LAB_0011fc42;
      local_138.x = 3.4028235e+38;
      local_138.y = 3.4028235e+38;
      aIStack_130[0].x = -3.4028235e+38;
      aIStack_130[0].y = -3.4028235e+38;
      switch(ShowMetricsWindow::show_windows_rect_type) {
      case 0:
        local_138 = pIVar9->Pos;
        aIStack_130[0].y = (pIVar9->Size).y + (pIVar9->Pos).y;
        aIStack_130[0].x = (pIVar9->Size).x + (pIVar9->Pos).x;
        goto switchD_0011fbd1_default;
      case 1:
        local_138.x = (pIVar9->OuterRectClipped).Min.x;
        local_138.y = (pIVar9->OuterRectClipped).Min.y;
        aIStack_130[0].x = (pIVar9->OuterRectClipped).Max.x;
        aIStack_130[0].y = (pIVar9->OuterRectClipped).Max.y;
        break;
      case 2:
        local_138.x = (pIVar9->InnerMainRect).Min.x;
        local_138.y = (pIVar9->InnerMainRect).Min.y;
        aIStack_130[0].x = (pIVar9->InnerMainRect).Max.x;
        aIStack_130[0].y = (pIVar9->InnerMainRect).Max.y;
        break;
      case 3:
        local_138.x = (pIVar9->InnerClipRect).Min.x;
        local_138.y = (pIVar9->InnerClipRect).Min.y;
        aIStack_130[0].x = (pIVar9->InnerClipRect).Max.x;
        aIStack_130[0].y = (pIVar9->InnerClipRect).Max.y;
        break;
      case 4:
        local_138.x = (pIVar9->ContentsRegionRect).Min.x;
        local_138.y = (pIVar9->ContentsRegionRect).Min.y;
        aIStack_130[0].x = (pIVar9->ContentsRegionRect).Max.x;
        aIStack_130[0].y = (pIVar9->ContentsRegionRect).Max.y;
        break;
      default:
        goto switchD_0011fbd1_default;
      }
switchD_0011fbd1_default:
      ImDrawList::AddRect(this,&local_138,aIStack_130,0xff8000ff,0.0,0xf,1.0);
LAB_0011fc42:
      if ((ShowMetricsWindow::show_windows_begin_order == true) &&
         ((pIVar9->Flags & 0x1000000) == 0)) {
        ImFormatString((char *)&local_138,0x20,"%d",
                       (ulong)(uint)(int)pIVar9->BeginOrderWithinContext);
        local_140.y = GImGui->FontSize + (pIVar9->Pos).y;
        local_140.x = GImGui->FontSize + (pIVar9->Pos).x;
        ImDrawList::AddRectFilled(this,&pIVar9->Pos,&local_140,0xff6464c8,0.0,0xf);
        ImDrawList::AddText(this,&pIVar9->Pos,0xffffffff,(char *)&local_138,(char *)0x0);
      }
LAB_0011fcd1:
      lVar13 = lVar13 + 1;
    } while (lVar13 < windows->Size);
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    enum { RT_OuterRect, RT_OuterRectClipped, RT_InnerMainRect, RT_InnerClipRect, RT_ContentsRegionRect, RT_ContentsFullRect };
    static bool show_windows_begin_order = false;
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = RT_ContentsRegionRect;
    static bool show_drawcmd_clip_rects = true;

    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    struct Funcs
    {
        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "idx" : "   ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    // Access private state, we are going to display the draw lists from last frame
    ImGuiContext& g = *GImGui;
    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tools"))
    {
        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##rects_type", &show_windows_rect_type, "OuterRect\0" "OuterRectClipped\0" "InnerMainRect\0" "InnerClipRect\0" "ContentsRegionRect\0");
        ImGui::Checkbox("Show clipping rectangle when hovering ImDrawCmd node", &show_drawcmd_clip_rects);
        ImGui::TreePop();
    }

    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r;
                if (show_windows_rect_type == RT_OuterRect)                 { r = window->Rect(); }
                else if (show_windows_rect_type == RT_OuterRectClipped)     { r = window->OuterRectClipped; }
                else if (show_windows_rect_type == RT_InnerMainRect)        { r = window->InnerMainRect; }
                else if (show_windows_rect_type == RT_InnerClipRect)        { r = window->InnerClipRect; }
                else if (show_windows_rect_type == RT_ContentsRegionRect)   { r = window->ContentsRegionRect; }
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }
    ImGui::End();
}